

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ModportPortSymbol::serializeTo(ModportPortSymbol *this,ASTSerializer *serializer)

{
  size_t __n;
  string_view name;
  
  __n = strlen(*(char **)(toString(slang::ast::ArgumentDirection)::strings +
                         (long)(int)this->direction * 8));
  ASTSerializer::write(serializer,9,"direction",__n);
  if (this->internalSymbol != (Symbol *)0x0) {
    name._M_str = "internalSymbol";
    name._M_len = 0xe;
    ASTSerializer::writeLink(serializer,name,this->internalSymbol);
  }
  if (this->explicitConnection != (Expression *)0x0) {
    ASTSerializer::write(serializer,0x12,"explicitConnection",(size_t)this->explicitConnection);
    return;
  }
  return;
}

Assistant:

void ModportPortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("direction", toString(direction));
    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
    if (explicitConnection)
        serializer.write("explicitConnection", *explicitConnection);
}